

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

FunctionCodeGenJitTimeData *
Js::FunctionCodeGenJitTimeData::New
          (Recycler *recycler,FunctionInfo *functionInfo,EntryPointInfo *entryPoint,bool isInlined)

{
  FunctionInfo *this;
  bool bVar1;
  ByteBlock *pBVar2;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  GlobalObject *this_02;
  Recycler *alloc;
  FunctionCodeGenJitTimeData *this_03;
  TrackAllocData local_70;
  FunctionBody *local_48;
  FunctionBody *functionBody;
  FunctionProxy *proxy;
  Var pvStack_30;
  uint16 profiledIterations;
  Var globalThis;
  EntryPointInfo *pEStack_20;
  bool isInlined_local;
  EntryPointInfo *entryPoint_local;
  FunctionInfo *functionInfo_local;
  Recycler *recycler_local;
  
  pvStack_30 = (Var)0x0;
  proxy._6_2_ = 0;
  globalThis._7_1_ = isInlined;
  pEStack_20 = entryPoint;
  entryPoint_local = (EntryPointInfo *)functionInfo;
  functionInfo_local = (FunctionInfo *)recycler;
  functionBody = (FunctionBody *)FunctionInfo::GetFunctionProxy(functionInfo);
  if (((functionBody != (FunctionBody *)0x0) &&
      (bVar1 = FunctionProxy::IsFunctionBody((FunctionProxy *)functionBody), bVar1)) &&
     (local_48 = FunctionProxy::GetFunctionBody((FunctionProxy *)functionBody),
     local_48 != (FunctionBody *)0x0)) {
    pBVar2 = FunctionBody::GetByteCode(local_48);
    if (pBVar2 != (ByteBlock *)0x0) {
      this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)local_48);
      this_01 = ScriptContext::GetLibrary(this_00);
      this_02 = JavascriptLibrary::GetGlobalObject(this_01);
      pvStack_30 = GlobalObject::ToThis(this_02);
      proxy._6_2_ = FunctionBody::GetProfiledIterations(local_48);
    }
    FunctionBody::LockDownCounters(local_48);
  }
  this = functionInfo_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
             ,0x30);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_70);
  this_03 = (FunctionCodeGenJitTimeData *)new<Memory::Recycler>(0xb0,alloc,0x43c4b0);
  FunctionCodeGenJitTimeData
            (this_03,(FunctionInfo *)entryPoint_local,pEStack_20,pvStack_30,proxy._6_2_,
             (bool)(globalThis._7_1_ & 1));
  return this_03;
}

Assistant:

FunctionCodeGenJitTimeData* FunctionCodeGenJitTimeData::New(Recycler* recycler, FunctionInfo *const functionInfo, EntryPointInfo *const entryPoint, bool isInlined)
    {
        Var globalThis = nullptr;
        uint16 profiledIterations = 0;
        FunctionProxy *proxy = functionInfo->GetFunctionProxy();
        if (proxy && proxy->IsFunctionBody())
        {
            FunctionBody* functionBody = proxy->GetFunctionBody();
            if (functionBody)
            {
                if (functionBody->GetByteCode())
                {
                    globalThis = functionBody->GetScriptContext()->GetLibrary()->GetGlobalObject()->ToThis();
                    profiledIterations = functionBody->GetProfiledIterations();
                }

                DebugOnly(functionBody->LockDownCounters());
            }
        }

        return RecyclerNew(recycler, FunctionCodeGenJitTimeData, functionInfo, entryPoint, globalThis, profiledIterations, isInlined);
    }